

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void do_express_myself(void)

{
  FILE *__stream;
  undefined8 uVar1;
  sockaddr_in addr;
  sockaddr_in addr_00;
  string local_58 [32];
  sockaddr_in local_38;
  string local_28 [8];
  string str_addr;
  
  fprintf(_stderr,"I am ");
  local_38.sin_family = my_addr.sin_family;
  local_38.sin_port = my_addr.sin_port;
  local_38.sin_addr.s_addr = my_addr.sin_addr.s_addr;
  local_38.sin_zero[0] = my_addr.sin_zero[0];
  local_38.sin_zero[1] = my_addr.sin_zero[1];
  local_38.sin_zero[2] = my_addr.sin_zero[2];
  local_38.sin_zero[3] = my_addr.sin_zero[3];
  local_38.sin_zero[4] = my_addr.sin_zero[4];
  local_38.sin_zero[5] = my_addr.sin_zero[5];
  local_38.sin_zero[6] = my_addr.sin_zero[6];
  local_38.sin_zero[7] = my_addr.sin_zero[7];
  addr.sin_zero = (uchar  [8])my_addr._0_8_;
  addr._0_8_ = local_28;
  pack_address_abi_cxx11_(addr);
  __stream = _stderr;
  uVar1 = std::__cxx11::string::c_str();
  fprintf(__stream,"%s\n",uVar1);
  if ((flag_root & 1U) == 0) {
    addr_00.sin_zero = (uchar  [8])my_addr._0_8_;
    addr_00._0_8_ = local_58;
    pack_address_abi_cxx11_(addr_00);
    std::__cxx11::string::operator=((string *)tosend_address_abi_cxx11_,local_58);
    std::__cxx11::string::~string(local_58);
    create_new_message(5,id_parent);
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void do_express_myself() {
    fprintf(stderr, "I am ");

    std::string str_addr = pack_address(my_addr);
    fprintf(stderr, "%s\n", str_addr.c_str());

    if (!flag_root) {
        tosend_address = pack_address(my_addr);
        create_new_message(CHILD, id_parent);
    }
}